

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

lua_Integer luaL_optinteger(lua_State *L,int idx,lua_Integer def)

{
  uint uVar1;
  StrScanFmt SVar2;
  TValue *pTVar3;
  TValue tmp;
  TValue local_28;
  
  pTVar3 = index2adr(L,idx);
  uVar1 = (pTVar3->field_2).it;
  if (0xfffefffe < uVar1) {
    if (uVar1 == 0xffffffff) {
      return def;
    }
    if ((uVar1 != 0xfffffffb) ||
       (SVar2 = lj_strscan_scan((uint8_t *)((ulong)(pTVar3->u32).lo + 0x10),&local_28,2),
       pTVar3 = &local_28, SVar2 == STRSCAN_ERROR)) {
      lj_err_argt(L,idx,3);
    }
  }
  return (long)pTVar3->n;
}

Assistant:

LUALIB_API lua_Integer luaL_optinteger(lua_State *L, int idx, lua_Integer def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else if (tvisnil(o)) {
    return def;
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      lj_err_argt(L, idx, LUA_TNUMBER);
    if (tvisint(&tmp))
      return (lua_Integer)intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}